

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# onepass.cc
# Opt level: O1

bool duckdb_re2::AddQ(Instq *q,int id)

{
  uint uVar1;
  int *piVar2;
  bool bVar3;
  
  bVar3 = true;
  if (id != 0) {
    piVar2 = (q->dense_).ptr_._M_t.super___uniq_ptr_impl<int,_duckdb_re2::PODArray<int>::Deleter>.
             _M_t.super__Tuple_impl<0UL,_int_*,_duckdb_re2::PODArray<int>::Deleter>.
             super__Head_base<0UL,_int_*,_false>._M_head_impl;
    if ((((piVar2 == (int *)0x0) ||
         ((uint)(q->dense_).ptr_._M_t.super___uniq_ptr_impl<int,_duckdb_re2::PODArray<int>::Deleter>
                ._M_t.super__Tuple_impl<0UL,_int_*,_duckdb_re2::PODArray<int>::Deleter>.
                super__Tuple_impl<1UL,_duckdb_re2::PODArray<int>::Deleter>.
                super__Head_base<1UL,_duckdb_re2::PODArray<int>::Deleter,_false> <= (uint)id)) ||
        (uVar1 = (q->sparse_).ptr_._M_t.
                 super___uniq_ptr_impl<int,_duckdb_re2::PODArray<int>::Deleter>._M_t.
                 super__Tuple_impl<0UL,_int_*,_duckdb_re2::PODArray<int>::Deleter>.
                 super__Head_base<0UL,_int_*,_false>._M_head_impl[id], (uint)q->size_ <= uVar1)) ||
       (piVar2[(int)uVar1] != id)) {
      SparseSetT<void>::InsertInternal(q,true,id);
    }
    else {
      bVar3 = false;
    }
  }
  return bVar3;
}

Assistant:

static bool AddQ(Instq *q, int id) {
  if (id == 0)
    return true;
  if (q->contains(id))
    return false;
  q->insert(id);
  return true;
}